

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_simplify_numsub_negk(jit_State *J)

{
  TRef TVar1;
  cTValue *tv;
  bool bVar2;
  
  bVar2 = ((J->fold).left.field_1.t.irt & 0x40) == 0;
  if (bVar2) {
    (J->fold).ins.field_0.op2 = (J->fold).left.field_0.op1;
    tv = lj_ir_k64_find(J,*(ulong *)(ulong)(J->fold).right.field_1.op12 ^ 0x8000000000000000);
    TVar1 = lj_ir_k64(J,IR_KNUM,tv);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  }
  return (uint)bVar2;
}

Assistant:

LJFOLD(SUB NEG KNUM)
LJFOLDF(simplify_numsub_negk)
{
  PHIBARRIER(fleft);
  fins->op2 = fleft->op1;  /* (-x) - k ==> (-k) - x */
  fins->op1 = (IRRef1)lj_ir_knum(J, -knumright);
  return RETRYFOLD;
}